

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

Data __thiscall
QDateTimePrivate::create
          (QDateTimePrivate *this,QDate toDate,QTime toTime,QTimeZone *zone,
          TransitionResolution resolve)

{
  long lVar1;
  undefined4 uVar2;
  int *piVar3;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_00;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = *(int *)&zone->d - 1U & 3;
  if (uVar4 < 2) {
    uVar5 = (ulong)(uVar4 * 0x10 + 1);
    this->super_QSharedData = (QSharedData)(int)uVar5;
    this->m_status = (StatusFlags)(int)(uVar5 >> 0x20);
  }
  else {
    piVar3 = (int *)operator_new(0x20);
    piVar3[0] = 0;
    piVar3[1] = 0;
    piVar3[2] = 0;
    piVar3[3] = 0;
    piVar3[4] = 0;
    QTimeZone::QTimeZone((QTimeZone *)(piVar3 + 6));
    *(int **)this = piVar3;
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    lVar1 = *(long *)this;
    *(uint *)(lVar1 + 4) = uVar4 << 4;
    if (uVar4 == 2) {
      uVar2 = (undefined4)((ulong)(zone->d).d >> 2);
      if (((int)(zone->d).d - 1U & 3) != 2) {
        uVar2 = 0;
      }
      *(undefined4 *)(lVar1 + 0x10) = uVar2;
    }
    else {
      QTimeZone::operator=((QTimeZone *)(lVar1 + 0x18),zone);
    }
  }
  setDateTime((QDateTimeData *)this,toDate,toTime);
  if ((*(int *)&zone->d - 1U & 3) - 1 < 2) {
    refreshSimpleDateTime((QDateTimeData *)this);
  }
  else {
    resolve_00.i = 0;
    if (resolve - LegacyBehavior < 6) {
      resolve_00.i = *(Int *)(&DAT_0055d01c + (ulong)(resolve - LegacyBehavior) * 4);
    }
    refreshZonedDateTime((QDateTimeData *)this,zone,(TransitionOptions)resolve_00.i);
  }
  return (Data)this;
}

Assistant:

Q_NEVER_INLINE
QDateTime::Data QDateTimePrivate::create(QDate toDate, QTime toTime, const QTimeZone &zone,
                                         QDateTime::TransitionResolution resolve)
{
    QDateTime::Data result(zone);
    setDateTime(result, toDate, toTime);
    if (zone.isUtcOrFixedOffset())
        refreshSimpleDateTime(result);
    else
        refreshZonedDateTime(result, zone, toTransitionOptions(resolve));
    return result;
}